

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite_orm.h
# Opt level: O0

void __thiscall
sqlite_orm::internal::storage_base::perform_query_without_result
          (storage_base *this,string *query,sqlite3 *db)

{
  error_code __ec;
  error_code __ec_00;
  int iVar1;
  undefined8 uVar2;
  error_category *peVar3;
  char *in_RDX;
  system_error *in_RSI;
  undefined8 in_RDI;
  error_category *unaff_retaddr;
  statement_finalizer finalizer;
  sqlite3_stmt *stmt;
  error_code local_58;
  error_code local_48 [2];
  statement_finalizer local_28;
  sqlite3_stmt *local_20;
  char *__what;
  
  __what = in_RDX;
  uVar2 = std::__cxx11::string::c_str();
  iVar1 = sqlite3_prepare_v2(in_RDX,uVar2,0xffffffff,&local_20,0);
  if (iVar1 != 0) {
    uVar2 = __cxa_allocate_exception(0x20);
    iVar1 = sqlite3_errcode(__what);
    peVar3 = &get_sqlite_error_category()->super_error_category;
    std::error_code::error_code(&local_58,iVar1,peVar3);
    sqlite3_errmsg(__what);
    __ec_00._M_cat = unaff_retaddr;
    __ec_00._0_8_ = in_RDI;
    std::system_error::system_error(in_RSI,__ec_00,__what);
    __cxa_throw(uVar2,&std::system_error::typeinfo,std::system_error::~system_error);
  }
  statement_finalizer::statement_finalizer(&local_28,local_20);
  iVar1 = sqlite3_step(local_20);
  if (iVar1 == 0x65) {
    statement_finalizer::~statement_finalizer((statement_finalizer *)0x241295);
    return;
  }
  uVar2 = __cxa_allocate_exception(0x20);
  iVar1 = sqlite3_errcode(__what);
  peVar3 = &get_sqlite_error_category()->super_error_category;
  std::error_code::error_code(local_48,iVar1,peVar3);
  sqlite3_errmsg(__what);
  __ec._M_cat = unaff_retaddr;
  __ec._0_8_ = in_RDI;
  std::system_error::system_error(in_RSI,__ec,__what);
  __cxa_throw(uVar2,&std::system_error::typeinfo,std::system_error::~system_error);
}

Assistant:

void perform_query_without_result(const std::string &query, sqlite3 *db) {
        sqlite3_stmt *stmt;
        if(sqlite3_prepare_v2(db, query.c_str(), -1, &stmt, nullptr) == SQLITE_OK) {
            statement_finalizer finalizer{stmt};
            if(sqlite3_step(stmt) == SQLITE_DONE) {
                //  done..
            } else {
                throw std::system_error(std::error_code(sqlite3_errcode(db), get_sqlite_error_category()),
                                        sqlite3_errmsg(db));
            }
        } else {
            throw std::system_error(std::error_code(sqlite3_errcode(db), get_sqlite_error_category()),
                                    sqlite3_errmsg(db));
        }
    }